

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsocks5socketengine.cpp
# Opt level: O1

ssize_t __thiscall
QSocks5SocketEngine::write(QSocks5SocketEngine *this,int __fd,void *__buf,size_t __n)

{
  char **this_00;
  undefined2 uVar1;
  long lVar2;
  long lVar3;
  void *pvVar4;
  long lVar5;
  undefined4 in_register_00000034;
  char *pcVar6;
  P _a;
  long in_FS_OFFSET;
  QByteArray local_88;
  QByteArray local_68;
  undefined4 local_50;
  undefined2 local_4c;
  undefined2 local_4a;
  undefined1 local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = *(long *)(this + 8);
  if (*(int *)(lVar2 + 0xdc) == 3) {
    uVar1 = *(undefined2 *)(lVar2 + 0xc0);
    QHostAddress::QHostAddress((QHostAddress *)&local_68);
    this_00 = &local_68.d.ptr;
    QHostAddress::QHostAddress((QHostAddress *)this_00,(QHostAddress *)(lVar2 + 0xb8));
    local_68.d.size = -0x100000000;
    local_50 = 0xffffffff;
    local_4c = 0;
    local_48 = 0;
    local_4a = uVar1;
    lVar3 = (**(code **)(*(long *)this + 0x100))
                      (this,(char *)CONCAT44(in_register_00000034,__fd),__buf,&local_68);
    QHostAddress::~QHostAddress((QHostAddress *)this_00);
    QHostAddress::~QHostAddress((QHostAddress *)&local_68);
  }
  else {
    lVar3 = -1;
    if (*(int *)(lVar2 + 0xdc) == 1) {
      pvVar4 = (void *)0x20000;
      if ((long)__buf < 0x20000) {
        pvVar4 = __buf;
      }
      lVar3 = (**(code **)(*(long *)**(undefined8 **)(lVar2 + 0xf8) + 0xa8))();
      lVar5 = (long)pvVar4 - lVar3;
      if (lVar5 == 0 || (long)pvVar4 < lVar3) {
        lVar3 = 0;
      }
      else {
        local_68.d.d = (Data *)0x0;
        local_88.d.d = (Data *)0x0;
        local_88.d.ptr = (char *)0x0;
        local_88.d.size = 0;
        local_68.d.ptr = (char *)CONCAT44(in_register_00000034,__fd);
        local_68.d.size = lVar5;
        QByteArray::operator=(&local_88,&local_68);
        pcVar6 = local_88.d.ptr;
        if (local_88.d.ptr == (char *)0x0) {
          pcVar6 = (char *)&QByteArray::_empty;
        }
        lVar3 = QIODevice::write((char *)**(undefined8 **)(lVar2 + 0xf8),(longlong)pcVar6);
        if (0 < lVar3) {
          (**(code **)(*(long *)**(undefined8 **)(lVar2 + 0xf8) + 0xc0))
                    ((long *)**(undefined8 **)(lVar2 + 0xf8),0);
          lVar3 = lVar5;
        }
        if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,1,0x10);
          }
        }
        if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,1,0x10);
          }
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return lVar3;
}

Assistant:

qint64 QSocks5SocketEngine::write(const char *data, qint64 len)
{
    Q_D(QSocks5SocketEngine);
    QSOCKS5_Q_DEBUG << "write" << dump(QByteArray(data, len));

    if (d->mode == QSocks5SocketEnginePrivate::ConnectMode) {
        // clamp down the amount of bytes to transfer at once
        len = qMin<qint64>(len, MaxWriteBufferSize) - d->data->controlSocket->bytesToWrite();
        if (len <= 0)
            return 0;

        QByteArray buf = QByteArray::fromRawData(data, len);
        QByteArray sealedBuf;
        if (!d->data->authenticator->seal(buf, &sealedBuf)) {
            // ### Handle this error.
        }
        // We pass pointer and size because 'sealedBuf' is (most definitely) raw data:
        // QIODevice might have to cache the byte array if the socket cannot write the data.
        // If the _whole_ array needs to be cached then it would simply store a copy of the
        // array whose data will go out of scope and be deallocated before it can be used.
        qint64 written = d->data->controlSocket->write(sealedBuf.constData(), sealedBuf.size());

        if (written <= 0) {
            QSOCKS5_Q_DEBUG << "native write returned" << written;
            return written;
        }
        d->data->controlSocket->waitForBytesWritten(0);
        //NB: returning len rather than written for the OK case, because the "sealing" may increase the length
        return len;
#ifndef QT_NO_UDPSOCKET
    } else if (d->mode == QSocks5SocketEnginePrivate::UdpAssociateMode) {
        // send to connected address
        return writeDatagram(data, len, QIpPacketHeader(d->peerAddress, d->peerPort));
#endif
    }
    //### set an error ???
    return -1;
}